

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O3

int __thiscall ON_Brep::GetMesh(ON_Brep *this,mesh_type mt,ON_SimpleArray<const_ON_Mesh_*> *meshes)

{
  shared_ptr<const_ON_Mesh> *psVar1;
  int iVar2;
  int iVar3;
  size_t new_capacity;
  int iVar4;
  long lVar5;
  long lVar6;
  ON_Mesh *mesh;
  element_type *local_40;
  long local_38;
  
  iVar4 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count;
  lVar5 = (long)iVar4;
  new_capacity = meshes->m_count + lVar5;
  if ((uint)meshes->m_capacity < (uint)new_capacity) {
    ON_SimpleArray<const_ON_Mesh_*>::SetCapacity(meshes,new_capacity);
  }
  local_38 = lVar5;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  else {
    lVar6 = 0;
    iVar4 = 0;
    do {
      psVar1 = ON_BrepFace::SharedMesh
                         ((ON_BrepFace *)
                          ((((this->m_F).super_ON_ObjectArray<ON_BrepFace>.
                             super_ON_ClassArray<ON_BrepFace>.m_a)->m_face_uuid).Data4 +
                          lVar6 + -0x5c),mt);
      local_40 = (psVar1->super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      ON_SimpleArray<const_ON_Mesh_*>::Append(meshes,&local_40);
      iVar4 = iVar4 + (uint)(local_40 == (element_type *)0x0);
      lVar6 = lVar6 + 0xd8;
    } while (lVar5 * 0xd8 - lVar6 != 0);
  }
  iVar3 = (int)local_38;
  if (iVar4 == iVar3) {
    iVar4 = 0;
    iVar2 = meshes->m_count - iVar3;
    iVar3 = iVar4;
    if ((-1 < iVar2) && (iVar2 <= meshes->m_capacity)) {
      meshes->m_count = iVar2;
    }
  }
  return iVar3;
}

Assistant:

int ON_Brep::GetMesh( ON::mesh_type mt, ON_SimpleArray<const ON_Mesh*>& meshes ) const
{
  int fcnt = m_F.Count();
  int fi;
  int null_count = 0;
  meshes.Reserve( meshes.Count() + fcnt );
  for ( fi = 0; fi < fcnt; fi++ )
  {
    const ON_Mesh* mesh = m_F[fi].Mesh(mt);
    meshes.Append( mesh );
    if ( !mesh )
    {
      // If some meshes are missing, we have to put
      // a null in the return array so the face-to-mesh
      // correspondence is preserved.
      null_count++;
    }
  }
  if ( null_count == fcnt )
  {
    // If ALL the meshes are missing, return 0.
    meshes.SetCount(meshes.Count()-fcnt);
    fcnt = 0;
  }
  return fcnt;
}